

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muhash.cpp
# Opt level: O2

void __thiscall Num3072::Square(Num3072 *this)

{
  ulong uVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  limb_t lVar7;
  ulong uVar8;
  ulong uVar9;
  int j;
  ulong uVar10;
  limb_t lVar11;
  int i;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  limb_t *plVar15;
  uint uVar16;
  long lVar17;
  limb_t *plVar18;
  limb_t *plVar19;
  long in_FS_OFFSET;
  bool bVar20;
  limb_t *local_228;
  limb_t d2;
  limb_t d1;
  limb_t d0;
  limb_t local_1d0;
  limb_t local_1c8;
  limb_t local_1c0;
  Num3072 tmp;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  local_1c0 = 0;
  local_1c8 = 0;
  local_1d0 = 0;
  SetToOne(&tmp);
  plVar15 = this->limbs;
  uVar14 = 1;
  lVar7 = 0;
  uVar9 = 0;
  uVar8 = 0;
  local_228 = this->limbs;
  while (plVar15 = plVar15 + 1, uVar9 != 0x2f) {
    d0 = 0;
    d1 = 0;
    d2 = 0;
    uVar13 = uVar14 >> 1;
    uVar16 = 0x2fU - (int)uVar9 >> 1;
    uVar1 = uVar9 + 1;
    plVar18 = this->limbs + 0x2f;
    plVar19 = plVar15;
    for (uVar12 = 0; uVar12 < uVar16; uVar12 = uVar12 + 1) {
      anon_unknown.dwarf_422176e::muldbladd3(&d0,&d1,&d2,plVar19,plVar18);
      plVar19 = plVar19 + 1;
      plVar18 = plVar18 + -1;
    }
    if ((uVar9 & 1) == 0) {
      anon_unknown.dwarf_422176e::muladd3
                (&d0,&d1,&d2,this->limbs + ((int)uVar1 + uVar16),this->limbs + (0x2f - uVar16));
    }
    auVar3._8_8_ = 0;
    auVar3._0_8_ = d0;
    uVar10 = SUB168(ZEXT816(0x10d765) * auVar3,8);
    uVar12 = SUB168(ZEXT816(0x10d765) * auVar3,0);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = d1;
    local_1c0 = uVar12 + uVar8;
    uVar8 = (ulong)CARRY8(uVar12,uVar8);
    uVar12 = lVar7 + uVar10;
    auVar6[8] = CARRY8(lVar7,uVar10) || CARRY8(uVar12,uVar8);
    auVar6._0_8_ = uVar12 + uVar8;
    auVar6._9_7_ = 0;
    auVar6 = ZEXT816(0x10d765) * auVar4 + auVar6;
    local_1c8 = auVar6._0_8_;
    local_1d0 = d2 * 0x10d765 + auVar6._8_8_;
    plVar18 = local_228;
    plVar19 = this->limbs;
    while (bVar20 = uVar13 != 0, uVar13 = uVar13 - 1, bVar20) {
      anon_unknown.dwarf_422176e::muldbladd3(&local_1c0,&local_1c8,&local_1d0,plVar19,plVar18);
      plVar19 = plVar19 + 1;
      plVar18 = plVar18 + -1;
    }
    if ((uVar9 & 1) == 0) {
      uVar8 = uVar1 >> 1 & 0x7fffffff;
      anon_unknown.dwarf_422176e::muladd3
                (&local_1c0,&local_1c8,&local_1d0,this->limbs + uVar8,
                 (limb_t *)((uVar9 - uVar8) * 8 + (long)this));
    }
    lVar7 = local_1d0;
    tmp.limbs[uVar9] = local_1c0;
    local_1c0 = local_1c8;
    uVar12 = local_1d0;
    local_1d0 = 0;
    uVar14 = uVar14 + 1;
    local_228 = local_228 + 1;
    uVar9 = uVar1;
    uVar8 = local_1c8;
    local_1c8 = uVar12;
  }
  lVar17 = 0x178;
  plVar15 = this->limbs;
  for (; lVar17 != 0xb8; lVar17 = lVar17 + -8) {
    anon_unknown.dwarf_422176e::muldbladd3
              (&local_1c0,&local_1c8,&local_1d0,plVar15,(limb_t *)((long)this->limbs + lVar17));
    plVar15 = plVar15 + 1;
  }
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_1c8;
  uVar14 = SUB168(ZEXT816(0x10d765) * auVar5,0);
  tmp.limbs[0x2f] = local_1c0;
  uVar9 = local_1d0 * 0x10d765 + SUB168(ZEXT816(0x10d765) * auVar5,8);
  for (lVar17 = 0; lVar17 != 0x30; lVar17 = lVar17 + 1) {
    bVar20 = CARRY8(uVar14,tmp.limbs[lVar17]);
    lVar11 = uVar14 + tmp.limbs[lVar17];
    uVar14 = uVar9 + 1;
    if (!bVar20) {
      uVar14 = uVar9;
    }
    uVar9 = (ulong)(bVar20 && uVar9 + 1 == 0);
    this->limbs[lVar17] = lVar11;
  }
  if (uVar9 == 0) {
    if (1 < uVar14) {
      __assert_fail("c0 == 0 || c0 == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/crypto/muhash.cpp"
                    ,0xf5,"void Num3072::Square()");
    }
    bVar20 = IsOverflow(this);
    if (bVar20) {
      FullReduce(this);
    }
    if (uVar14 == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        return;
      }
    }
    else if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      FullReduce(this);
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("c1 == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/crypto/muhash.cpp"
                ,0xf4,"void Num3072::Square()");
}

Assistant:

void Num3072::Square()
{
    limb_t c0 = 0, c1 = 0, c2 = 0;
    Num3072 tmp;

    /* Compute limbs 0..N-2 of this*this into tmp, including one reduction. */
    for (int j = 0; j < LIMBS - 1; ++j) {
        limb_t d0 = 0, d1 = 0, d2 = 0;
        for (int i = 0; i < (LIMBS - 1 - j) / 2; ++i) muldbladd3(d0, d1, d2, this->limbs[i + j + 1], this->limbs[LIMBS - 1 - i]);
        if ((j + 1) & 1) muladd3(d0, d1, d2, this->limbs[(LIMBS - 1 - j) / 2 + j + 1], this->limbs[LIMBS - 1 - (LIMBS - 1 - j) / 2]);
        mulnadd3(c0, c1, c2, d0, d1, d2, MAX_PRIME_DIFF);
        for (int i = 0; i < (j + 1) / 2; ++i) muldbladd3(c0, c1, c2, this->limbs[i], this->limbs[j - i]);
        if ((j + 1) & 1) muladd3(c0, c1, c2, this->limbs[(j + 1) / 2], this->limbs[j - (j + 1) / 2]);
        extract3(c0, c1, c2, tmp.limbs[j]);
    }

    assert(c2 == 0);
    for (int i = 0; i < LIMBS / 2; ++i) muldbladd3(c0, c1, c2, this->limbs[i], this->limbs[LIMBS - 1 - i]);
    extract3(c0, c1, c2, tmp.limbs[LIMBS - 1]);

    /* Perform a second reduction. */
    muln2(c0, c1, MAX_PRIME_DIFF);
    for (int j = 0; j < LIMBS; ++j) {
        addnextract2(c0, c1, tmp.limbs[j], this->limbs[j]);
    }

    assert(c1 == 0);
    assert(c0 == 0 || c0 == 1);

    /* Perform up to two more reductions if the internal state has already
     * overflown the MAX of Num3072 or if it is larger than the modulus or
     * if both are the case.
     * */
    if (this->IsOverflow()) this->FullReduce();
    if (c0) this->FullReduce();
}